

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::EmuD3D6::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,EmuD3D6 *this)

{
  uint32_t cls;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdDmaGrobj *pMVar2;
  MthdCtxSurf3D *this_04;
  MthdEmuD3D56TexOffset *pMVar3;
  MthdEmuD3D56TexFormat *pMVar4;
  MthdEmuD3D56TexFilter *pMVar5;
  MthdEmuD3D6CombineControl *pMVar6;
  MthdEmuD3D6CombineFactor *this_05;
  MthdEmuD3D56Blend *this_06;
  MthdEmuD3D56Config *this_07;
  MthdEmuD3D6StencilFunc *this_08;
  MthdEmuD3D6StencilOp *this_09;
  MthdEmuD3D56FogColor *this_10;
  MthdEmuD3D56TlvX *this_11;
  MthdEmuD3D56TlvY *this_12;
  MthdEmuD3D56TlvZ *this_13;
  MthdEmuD3D56TlvW *this_14;
  MthdEmuD3D56TlvColor *this_15;
  MthdEmuD3D56TlvFogCol1 *this_16;
  MthdEmuD3D56TlvUv *pMVar7;
  UntestedMthd *this_17;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_693;
  undefined1 local_692;
  allocator local_691;
  string local_690 [38];
  undefined1 local_66a;
  allocator local_669;
  string local_668 [38];
  undefined1 local_642;
  allocator local_641;
  string local_640 [38];
  undefined1 local_61a;
  allocator local_619;
  string local_618 [38];
  undefined1 local_5f2;
  allocator local_5f1;
  string local_5f0 [38];
  undefined1 local_5ca;
  allocator local_5c9;
  string local_5c8 [38];
  undefined1 local_5a2;
  allocator local_5a1;
  string local_5a0 [38];
  undefined1 local_57a;
  allocator local_579;
  string local_578 [38];
  undefined1 local_552;
  allocator local_551;
  string local_550 [38];
  undefined1 local_52a;
  allocator local_529;
  string local_528 [38];
  undefined1 local_502;
  allocator local_501;
  string local_500 [38];
  undefined1 local_4da;
  allocator local_4d9;
  string local_4d8 [38];
  undefined1 local_4b2;
  allocator local_4b1;
  string local_4b0 [38];
  undefined1 local_48a;
  allocator local_489;
  string local_488 [38];
  undefined1 local_462;
  allocator local_461;
  string local_460 [38];
  undefined1 local_43a;
  allocator local_439;
  string local_438 [38];
  undefined1 local_412;
  allocator local_411;
  string local_410 [38];
  undefined1 local_3ea;
  allocator local_3e9;
  string local_3e8 [38];
  undefined1 local_3c2;
  allocator local_3c1;
  string local_3c0 [38];
  undefined1 local_39a;
  allocator local_399;
  string local_398 [38];
  undefined1 local_372;
  allocator local_371;
  string local_370 [38];
  undefined1 local_34a;
  allocator local_349;
  string local_348 [38];
  undefined1 local_322;
  allocator local_321;
  string local_320 [38];
  undefined1 local_2fa;
  allocator local_2f9;
  string local_2f8 [38];
  undefined1 local_2d2;
  allocator local_2d1;
  string local_2d0 [38];
  undefined1 local_2aa;
  allocator local_2a9;
  string local_2a8 [38];
  undefined1 local_282;
  allocator local_281;
  string local_280 [38];
  undefined1 local_25a;
  allocator local_259;
  string local_258 [38];
  undefined1 local_232;
  allocator local_231;
  string local_230 [38];
  undefined1 local_20a;
  allocator local_209;
  string local_208 [38];
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [38];
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator local_191;
  string local_190 [38];
  undefined1 local_16a;
  allocator local_169;
  string local_168 [48];
  SingleMthdTest *local_138;
  MthdNotify *local_130;
  MthdPmTrigger *local_128;
  MthdDmaNotify *local_120;
  MthdDmaGrobj *local_118;
  MthdDmaGrobj *local_110;
  MthdCtxSurf3D *local_108;
  MthdEmuD3D56TexOffset *local_100;
  MthdEmuD3D56TexOffset *local_f8;
  MthdEmuD3D56TexFormat *local_f0;
  MthdEmuD3D56TexFormat *local_e8;
  MthdEmuD3D56TexFilter *local_e0;
  MthdEmuD3D56TexFilter *local_d8;
  MthdEmuD3D6CombineControl *local_d0;
  MthdEmuD3D6CombineControl *local_c8;
  MthdEmuD3D6CombineControl *local_c0;
  MthdEmuD3D6CombineControl *local_b8;
  MthdEmuD3D6CombineFactor *local_b0;
  MthdEmuD3D56Blend *local_a8;
  MthdEmuD3D56Config *local_a0;
  MthdEmuD3D6StencilFunc *local_98;
  MthdEmuD3D6StencilOp *local_90;
  MthdEmuD3D56FogColor *local_88;
  MthdEmuD3D56TlvX *local_80;
  MthdEmuD3D56TlvY *local_78;
  MthdEmuD3D56TlvZ *local_70;
  MthdEmuD3D56TlvW *local_68;
  MthdEmuD3D56TlvColor *local_60;
  MthdEmuD3D56TlvFogCol1 *local_58;
  MthdEmuD3D56TlvUv *local_50;
  MthdEmuD3D56TlvUv *local_48;
  MthdEmuD3D56TlvUv *local_40;
  MthdEmuD3D56TlvUv *local_38;
  UntestedMthd *local_30;
  iterator local_28;
  size_type local_20;
  EmuD3D6 *local_18;
  EmuD3D6 *this_local;
  
  local_18 = this;
  this_local = (EmuD3D6 *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_16a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"nop",&local_169);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_168,-1,
             (this->super_Class).cls,0x100,1,4);
  local_16a = 0;
  local_138 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_192 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"notify",&local_191);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_190,0,
             (this->super_Class).cls,0x104,1,4);
  local_192 = 0;
  local_130 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_1ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"pm_trigger",&local_1b9);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1b8,-1,
             (this->super_Class).cls,0x140,1,4);
  local_1ba = 0;
  local_128 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_1e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"dma_notify",&local_1e1);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1e0,1,
             (this->super_Class).cls,0x180,1,4);
  local_1e2 = 0;
  local_120 = this_03;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_20a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"dma_tex_a",&local_209);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_208,2,
             (this->super_Class).cls,0x184,0,4);
  local_20a = 0;
  local_118 = pMVar2;
  pMVar2 = (MthdDmaGrobj *)operator_new(0x25960);
  local_232 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"dma_tex_b",&local_231);
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_230,3,
             (this->super_Class).cls,0x188,1,4);
  local_232 = 0;
  local_110 = pMVar2;
  this_04 = (MthdCtxSurf3D *)operator_new(0x25958);
  local_25a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"ctx_surf3d",&local_259);
  cls = (this->super_Class).cls;
  MthdCtxSurf3D::MthdCtxSurf3D
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_258,4,cls,0x18c,
             (uint)(cls != 0x55));
  local_25a = 0;
  local_108 = this_04;
  pMVar3 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  local_282 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"tex_0_offset",&local_281);
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_280,5,
             (this->super_Class).cls,0x308,1);
  local_282 = 0;
  local_100 = pMVar3;
  pMVar3 = (MthdEmuD3D56TexOffset *)operator_new(0x25958);
  local_2aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"tex_1_offset",&local_2a9);
  MthdEmuD3D56TexOffset::MthdEmuD3D56TexOffset
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2a8,6,
             (this->super_Class).cls,0x30c,2);
  local_2aa = 0;
  local_f8 = pMVar3;
  pMVar4 = (MthdEmuD3D56TexFormat *)operator_new(0x25958);
  local_2d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"tex_0_format",&local_2d1);
  MthdEmuD3D56TexFormat::MthdEmuD3D56TexFormat
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2d0,7,
             (this->super_Class).cls,0x310,1);
  local_2d2 = 0;
  local_f0 = pMVar4;
  pMVar4 = (MthdEmuD3D56TexFormat *)operator_new(0x25958);
  local_2fa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"tex_1_format",&local_2f9);
  MthdEmuD3D56TexFormat::MthdEmuD3D56TexFormat
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_2f8,8,
             (this->super_Class).cls,0x314,2);
  local_2fa = 0;
  local_e8 = pMVar4;
  pMVar5 = (MthdEmuD3D56TexFilter *)operator_new(0x25958);
  local_322 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"tex_0_filter",&local_321);
  MthdEmuD3D56TexFilter::MthdEmuD3D56TexFilter
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_320,9,
             (this->super_Class).cls,0x318,1);
  local_322 = 0;
  local_e0 = pMVar5;
  pMVar5 = (MthdEmuD3D56TexFilter *)operator_new(0x25958);
  local_34a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"tex_1_filter",&local_349);
  MthdEmuD3D56TexFilter::MthdEmuD3D56TexFilter
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_348,10,
             (this->super_Class).cls,0x31c,2);
  local_34a = 0;
  local_d8 = pMVar5;
  pMVar6 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  local_372 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"combine_0_control_alpha",&local_371);
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_370,0xb,
             (this->super_Class).cls,800,0,0);
  local_372 = 0;
  local_d0 = pMVar6;
  pMVar6 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  local_39a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"combine_0_control_color",&local_399);
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_398,0xc,
             (this->super_Class).cls,0x324,0,1);
  local_39a = 0;
  local_c8 = pMVar6;
  pMVar6 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  local_3c2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"combine_1_control_alpha",&local_3c1);
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3c0,0xd,
             (this->super_Class).cls,0x32c,1,0);
  local_3c2 = 0;
  local_c0 = pMVar6;
  pMVar6 = (MthdEmuD3D6CombineControl *)operator_new(0x25958);
  local_3ea = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"combine_1_control_color",&local_3e9);
  MthdEmuD3D6CombineControl::MthdEmuD3D6CombineControl
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_3e8,0xe,
             (this->super_Class).cls,0x330,1,1);
  local_3ea = 0;
  local_b8 = pMVar6;
  this_05 = (MthdEmuD3D6CombineFactor *)operator_new(0x25950);
  local_412 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"combine_factor",&local_411);
  MthdEmuD3D6CombineFactor::SingleMthdTest
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_410,0xf,
             (this->super_Class).cls,0x334,1,4);
  local_412 = 0;
  local_b0 = this_05;
  this_06 = (MthdEmuD3D56Blend *)operator_new(0x25950);
  local_43a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"blend",&local_439);
  MthdEmuD3D56Blend::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_438,0x10,
             (this->super_Class).cls,0x338,1,4);
  local_43a = 0;
  local_a8 = this_06;
  this_07 = (MthdEmuD3D56Config *)operator_new(0x25950);
  local_462 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_460,"config",&local_461);
  MthdEmuD3D56Config::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_460,0x11,
             (this->super_Class).cls,0x33c,1,4);
  local_462 = 0;
  local_a0 = this_07;
  this_08 = (MthdEmuD3D6StencilFunc *)operator_new(0x25950);
  local_48a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"stencil_func",&local_489);
  MthdEmuD3D6StencilFunc::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_488,0x12,
             (this->super_Class).cls,0x340,1,4);
  local_48a = 0;
  local_98 = this_08;
  this_09 = (MthdEmuD3D6StencilOp *)operator_new(0x25950);
  local_4b2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"stencil_op",&local_4b1);
  MthdEmuD3D6StencilOp::SingleMthdTest
            (this_09,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4b0,0x13,
             (this->super_Class).cls,0x344,1,4);
  local_4b2 = 0;
  local_90 = this_09;
  this_10 = (MthdEmuD3D56FogColor *)operator_new(0x25950);
  local_4da = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d8,"fog_color",&local_4d9);
  MthdEmuD3D56FogColor::SingleMthdTest
            (this_10,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_4d8,0x14,
             (this->super_Class).cls,0x348,1,4);
  local_4da = 0;
  local_88 = this_10;
  this_11 = (MthdEmuD3D56TlvX *)operator_new(0x25950);
  local_502 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_500,"tlv_x",&local_501);
  MthdEmuD3D56TlvX::SingleMthdTest
            (this_11,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_500,0x15,
             (this->super_Class).cls,0x400,8,0x28);
  local_502 = 0;
  local_80 = this_11;
  this_12 = (MthdEmuD3D56TlvY *)operator_new(0x25950);
  local_52a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"tlv_y",&local_529);
  MthdEmuD3D56TlvY::SingleMthdTest
            (this_12,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_528,0x16,
             (this->super_Class).cls,0x404,8,0x28);
  local_52a = 0;
  local_78 = this_12;
  this_13 = (MthdEmuD3D56TlvZ *)operator_new(0x25950);
  local_552 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"tlv_z",&local_551);
  MthdEmuD3D56TlvZ::SingleMthdTest
            (this_13,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_550,0x17,
             (this->super_Class).cls,0x408,8,0x28);
  local_552 = 0;
  local_70 = this_13;
  this_14 = (MthdEmuD3D56TlvW *)operator_new(0x25950);
  local_57a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"tlv_rhw",&local_579);
  MthdEmuD3D56TlvW::SingleMthdTest
            (this_14,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_578,0x18,
             (this->super_Class).cls,0x40c,8,0x28);
  local_57a = 0;
  local_68 = this_14;
  this_15 = (MthdEmuD3D56TlvColor *)operator_new(0x25950);
  local_5a2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"tlv_color",&local_5a1);
  MthdEmuD3D56TlvColor::SingleMthdTest
            (this_15,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_5a0,0x19,
             (this->super_Class).cls,0x410,8,0x28);
  local_5a2 = 0;
  local_60 = this_15;
  this_16 = (MthdEmuD3D56TlvFogCol1 *)operator_new(0x25950);
  local_5ca = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"tlv_fog_col1",&local_5c9);
  MthdEmuD3D56TlvFogCol1::SingleMthdTest
            (this_16,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_5c8,0x1a,
             (this->super_Class).cls,0x414,8,0x28);
  local_5ca = 0;
  local_58 = this_16;
  pMVar7 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  local_5f2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"tlv_u_0",&local_5f1);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_5f0,0x1b,
             (this->super_Class).cls,0x418,8,0x28,0,0,false);
  local_5f2 = 0;
  local_50 = pMVar7;
  pMVar7 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  local_61a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"tlv_v_0",&local_619);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_618,0x1c,
             (this->super_Class).cls,0x41c,8,0x28,0,1,false);
  local_61a = 0;
  local_48 = pMVar7;
  pMVar7 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  local_642 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"tlv_u_1",&local_641);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_640,0x1d,
             (this->super_Class).cls,0x420,8,0x28,1,0,false);
  local_642 = 0;
  local_40 = pMVar7;
  pMVar7 = (MthdEmuD3D56TlvUv *)operator_new(0x25960);
  local_66a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"tlv_v_1",&local_669);
  MthdEmuD3D56TlvUv::MthdEmuD3D56TlvUv
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_668,0x1e,
             (this->super_Class).cls,0x424,8,0x28,1,1,true);
  local_66a = 0;
  local_38 = pMVar7;
  this_17 = (UntestedMthd *)operator_new(0x25950);
  local_692 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"draw",&local_691);
  UntestedMthd::SingleMthdTest
            (this_17,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_690,0x1f,
             (this->super_Class).cls,0x540,0x30,4);
  local_692 = 0;
  local_28 = &local_138;
  local_20 = 0x22;
  local_30 = this_17;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_693);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_693);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_693);
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> EmuD3D6::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", 2, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", 3, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", 4, cls, 0x18c, cls == 0x55 ? SURF2D_NV4 : SURF2D_NV10),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_0_offset", 5, cls, 0x308, 1),
		new MthdEmuD3D56TexOffset(opt, rnd(), "tex_1_offset", 6, cls, 0x30c, 2),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_0_format", 7, cls, 0x310, 1),
		new MthdEmuD3D56TexFormat(opt, rnd(), "tex_1_format", 8, cls, 0x314, 2),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_0_filter", 9, cls, 0x318, 1),
		new MthdEmuD3D56TexFilter(opt, rnd(), "tex_1_filter", 10, cls, 0x31c, 2),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_alpha", 11, cls, 0x320, 0, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_0_control_color", 12, cls, 0x324, 0, 1),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_alpha", 13, cls, 0x32c, 1, 0),
		new MthdEmuD3D6CombineControl(opt, rnd(), "combine_1_control_color", 14, cls, 0x330, 1, 1),
		new MthdEmuD3D6CombineFactor(opt, rnd(), "combine_factor", 15, cls, 0x334),
		new MthdEmuD3D56Blend(opt, rnd(), "blend", 16, cls, 0x338),
		new MthdEmuD3D56Config(opt, rnd(), "config", 17, cls, 0x33c),
		new MthdEmuD3D6StencilFunc(opt, rnd(), "stencil_func", 18, cls, 0x340),
		new MthdEmuD3D6StencilOp(opt, rnd(), "stencil_op", 19, cls, 0x344),
		new MthdEmuD3D56FogColor(opt, rnd(), "fog_color", 20, cls, 0x348),
		new MthdEmuD3D56TlvX(opt, rnd(), "tlv_x", 21, cls, 0x400, 8, 0x28),
		new MthdEmuD3D56TlvY(opt, rnd(), "tlv_y", 22, cls, 0x404, 8, 0x28),
		new MthdEmuD3D56TlvZ(opt, rnd(), "tlv_z", 23, cls, 0x408, 8, 0x28),
		new MthdEmuD3D56TlvW(opt, rnd(), "tlv_rhw", 24, cls, 0x40c, 8, 0x28),
		new MthdEmuD3D56TlvColor(opt, rnd(), "tlv_color", 25, cls, 0x410, 8, 0x28),
		new MthdEmuD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", 26, cls, 0x414, 8, 0x28),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_0", 27, cls, 0x418, 8, 0x28, 0, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_0", 28, cls, 0x41c, 8, 0x28, 0, 1, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_u_1", 29, cls, 0x420, 8, 0x28, 1, 0, false),
		new MthdEmuD3D56TlvUv(opt, rnd(), "tlv_v_1", 30, cls, 0x424, 8, 0x28, 1, 1, true),
		new UntestedMthd(opt, rnd(), "draw", 31, cls, 0x540, 0x30),
	};
}